

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::DirectStateAccess::Queries::ErrorsTest::iterate(ErrorsTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *this_01;
  TestLog *this_02;
  MessageBuilder *this_03;
  undefined4 *puVar4;
  MessageBuilder local_1b0;
  byte local_2f;
  byte local_2e;
  undefined1 local_2d;
  deUint32 local_2c;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  local_2c = (deUint32)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)local_2c);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    this->m_pGetQueryBufferObjectiv = *(PFNGLGETQUERYBUFFEROBJECT *)(lStack_20 + 0x9e8);
    this->m_pGetQueryBufferObjectuiv = *(PFNGLGETQUERYBUFFEROBJECT *)(lStack_20 + 0x9f8);
    this->m_pGetQueryBufferObjecti64v = *(PFNGLGETQUERYBUFFEROBJECT *)(lStack_20 + 0x9e0);
    this->m_pGetQueryBufferObjectui64v = *(PFNGLGETQUERYBUFFEROBJECT *)(lStack_20 + 0x9f0);
    local_2e = 1;
    local_2f = 0;
    if ((this->m_pGetQueryBufferObjectiv == (PFNGLGETQUERYBUFFEROBJECT)0x0) ||
       (((this->m_pGetQueryBufferObjectuiv == (PFNGLGETQUERYBUFFEROBJECT)0x0 ||
         (this->m_pGetQueryBufferObjecti64v == (PFNGLGETQUERYBUFFEROBJECT)0x0)) ||
        (this->m_pGetQueryBufferObjectui64v == (PFNGLGETQUERYBUFFEROBJECT)0x0)))) {
      this_01 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      this_02 = tcu::TestContext::getLog(this_01);
      tcu::TestLog::operator<<(&local_1b0,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
      this_03 = tcu::MessageBuilder::operator<<
                          (&local_1b0,
                           (char (*) [71])
                           "Test could not get the pointers for glGetQueryBufferObject* functions.")
      ;
      tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    bVar1 = testNegativeNumberOfObjects(this);
    local_2e = bVar1 & local_2e;
    bVar1 = testInvalidTarget(this);
    local_2e = bVar1 & local_2e;
    bVar1 = testInvalidQueryName(this);
    local_2e = bVar1 & local_2e;
    bVar1 = testInvalidBufferName(this);
    local_2e = bVar1 & local_2e;
    bVar1 = testInvalidParameterName(this);
    local_2e = bVar1 & local_2e;
    bVar1 = testBufferOverflow(this);
    local_2e = bVar1 & local_2e;
    bVar1 = testBufferNegativeOffset(this);
    local_2e = (local_2e & 1 & bVar1) != 0;
    if ((bool)local_2e) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else if ((local_2f & 1) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_INTERNAL_ERROR,"Error");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Getting function pointers. */
	m_pGetQueryBufferObjectiv	= (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectiv;
	m_pGetQueryBufferObjectuiv   = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectuiv;
	m_pGetQueryBufferObjecti64v  = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjecti64v;
	m_pGetQueryBufferObjectui64v = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectui64v;

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		if ((DE_NULL == m_pGetQueryBufferObjectiv) || (DE_NULL == m_pGetQueryBufferObjectuiv) ||
			(DE_NULL == m_pGetQueryBufferObjecti64v) || (DE_NULL == m_pGetQueryBufferObjectui64v))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Test could not get the pointers for glGetQueryBufferObject* functions."
				<< tcu::TestLog::EndMessage;

			throw 0;
		}

		is_ok &= testNegativeNumberOfObjects();
		is_ok &= testInvalidTarget();
		is_ok &= testInvalidQueryName();
		is_ok &= testInvalidBufferName();
		is_ok &= testInvalidParameterName();
		is_ok &= testBufferOverflow();
		is_ok &= testBufferNegativeOffset();
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}